

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChDampingKirchhoff::ComputeDampingMatrix
          (ChDampingKirchhoff *this,ChMatrixRef *R,ChVector<double> *deps,ChVector<double> *dkur,
          double z_inf,double z_sup,double angle)

{
  Scalar *pSVar1;
  long row;
  double local_1b0;
  Matrix<double,_6,_1,_0,_6,_1> *local_1a8;
  ChVectorN<double,_6> *local_1a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_190;
  ChVectorN<double,_6> stress_0;
  ChVector<double> m;
  ChVector<double> n;
  ChVector<double> ddeps;
  ChVectorN<double,_6> stress_d;
  ChVectorN<double,_6> stress_1;
  ChVectorN<double,_6> dstrain_0;
  ChVector<double> ddkur;
  
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value != 6) {
    __assert_fail("R.rows() == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellKirchhoff.cpp"
                  ,0x173,
                  "virtual void chrono::fea::ChDampingKirchhoff::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 6) {
    Eigen::
    DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
    setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             *)R);
    stress_0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         = (double)deps;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_190,&dstrain_0,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_190,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&stress_0
              );
    stress_0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         = (double)dkur;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_190,&dstrain_0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_190,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&stress_0
              );
    n.m_data[0] = 0.0;
    n.m_data[1] = 0.0;
    m.m_data[0] = 0.0;
    m.m_data[1] = 0.0;
    n.m_data[2] = 0.0;
    m.m_data[2] = 0.0;
    (*this->_vptr_ChDampingKirchhoff[2])(z_inf,z_sup,angle,this,&n,&m,deps,dkur);
    stress_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         = (double)&n;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_190,&stress_0,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_190,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&stress_1);
    stress_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         = (double)&m;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_190,&stress_0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_190,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&stress_1);
    for (row = 0; row != 6; row = row + 1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&dstrain_0,row
                          ,0);
      *pSVar1 = *pSVar1 + 1e-09;
      Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_190,
                 (Matrix<double,_6,_1,_0,_6,_1> *)&dstrain_0,0,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
                (&ddeps,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                         *)&local_190,(type *)0x0);
      Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_190,
                 (Matrix<double,_6,_1,_0,_6,_1> *)&dstrain_0,3,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
                (&ddkur,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                         *)&local_190,(type *)0x0);
      (*this->_vptr_ChDampingKirchhoff[2])(z_inf,z_sup,angle,this,&n,&m,&ddeps,&ddkur);
      stress_d.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)&n;
      Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_190,&stress_1,0,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_190,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&stress_d);
      stress_d.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)&m;
      Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_190,&stress_1,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_190,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&stress_d);
      local_1a0 = &stress_0;
      local_1b0 = 999999999.9999999;
      local_1a8 = &stress_1;
      Eigen::operator*(&local_190,&local_1b0,(StorageBaseType *)&local_1a8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&stress_d,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                  *)&local_190);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
               *)&local_190,R,0,row,6,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::Matrix<double,6,1,0,6,1>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                  *)&local_190,(Matrix<double,_6,_1,_0,_6,_1> *)&stress_d);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&dstrain_0,row
                          ,0);
      *pSVar1 = *pSVar1 + -1e-09;
    }
    return;
  }
  __assert_fail("R.cols() == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellKirchhoff.cpp"
                ,0x174,
                "virtual void chrono::fea::ChDampingKirchhoff::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
               );
}

Assistant:

void ChDampingKirchhoff::ComputeDampingMatrix(
    ChMatrixRef R,             // 6x6 material damping matrix values here
    const ChVector<>& deps,  // time derivative of strains 
    const ChVector<>& dkur,  // time derivative of curvatures
    const double z_inf,        // layer lower z value (along thickness coord)
    const double z_sup,        // layer upper z value (along thickness coord)
    const double angle         // layer angle respect to x (if needed) -not used in this, isotropic+
) {
    assert(R.rows() == 6);
    assert(R.cols() == 6);

    R.setZero();

    ChVectorN<double, 6> dstrain_0;
    dstrain_0.segment(0, 3) = deps.eigen();
    dstrain_0.segment(3, 3) = dkur.eigen();

    ChVector<> n, m;
    this->ComputeStress(n, m, deps, dkur, z_inf, z_sup, angle);

    ChVectorN<double, 6> stress_0;
    stress_0.segment(0,3) = n.eigen();
    stress_0.segment(3,3) = m.eigen();
    

    double delta = 1e-9;
    for (int i = 0; i < 6; ++i) {
        dstrain_0(i, 0) += delta;
        ChVector<> ddeps(dstrain_0.segment(0, 3));
        ChVector<> ddkur(dstrain_0.segment(3, 3));
        this->ComputeStress(n, m, ddeps, ddkur, z_inf, z_sup, angle);
        ChVectorN<double, 6> stress_1;
        stress_1.segment(0,3) = n.eigen();
        stress_1.segment(3,3) = m.eigen();
        ChVectorN<double, 6> stress_d = (1. / delta) * (stress_1 - stress_0);
        R.block(0, i, 6, 1) = stress_d;
        dstrain_0(i, 0) -= delta;
    }
}